

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

ssize_t __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::RpcRequest::send
          (RpcRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ushort uVar1;
  RpcConnectionState *pRVar2;
  RpcClient *pRVar3;
  void *pvVar4;
  undefined8 uVar5;
  PointerReader other;
  ClientHook *pCVar6;
  TransformPromiseNodeBase *this_00;
  size_t __n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  RpcRequest *this_01;
  int __flags_00;
  anon_union_344_2_a774ebf0_for_OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,_kj::Exception>_3
  *other_00;
  MessageSize MVar7;
  ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
  forkedPromise;
  Own<capnp::ClientHook> local_3a8;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline> pipeline;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:1430:13),_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
  appPromise;
  Own<kj::_::PromiseNode> local_378;
  undefined1 local_368 [80];
  Request<capnp::AnyPointer,_capnp::AnyPointer> replacement;
  undefined1 local_1c0 [8];
  pointer local_1b8;
  uint local_1b0;
  Builder local_1a8;
  SendInternalResult sendResult;
  
  this_01 = (RpcRequest *)CONCAT44(in_register_00000034,__fd);
  pRVar2 = (this_01->connectionState).ptr;
  if ((pRVar2->connection).tag == 1) {
    pRVar3 = (this_01->target).ptr;
    rpc::Call::Builder::getTarget(&local_1a8,&this_01->callBuilder);
    (*(pRVar3->super_ClientHook)._vptr_ClientHook[8])(&replacement,pRVar3);
    local_3a8.disposer = (Disposer *)replacement.super_Builder.builder.segment;
    local_3a8.ptr = (ClientHook *)replacement.super_Builder.builder.capTable;
    replacement.super_Builder.builder.capTable = (CapTableBuilder *)0x0;
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&replacement);
    pCVar6 = local_3a8.ptr;
    if (local_3a8.ptr == (ClientHook *)0x0) {
      sendInternal(&sendResult,this_01,false);
      kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>::fork
                ((Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                  *)&forkedPromise);
      pRVar2 = (this_01->connectionState).ptr;
      kj::ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
      ::addBranch((ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                   *)&replacement);
      kj::
      refcounted<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline,capnp::_::(anonymous_namespace)::RpcConnectionState&,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>,kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>>>
                ((RpcConnectionState *)&pipeline,
                 (Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef> *)pRVar2,
                 (Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                  *)&sendResult);
      kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&replacement);
      kj::ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
      ::addBranch((ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                   *)&local_378);
      this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_378,
                 kj::_::
                 TransformPromiseNode<capnp::Response<capnp::AnyPointer>,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:1430:13),_kj::_::PropagateException>
                 ::anon_class_1_0_00000001_for_func::operator());
      (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0066ff48;
      replacement.super_Builder.builder.segment =
           (SegmentBuilder *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<capnp::Response<capnp::AnyPointer>,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,capnp::_::(anonymous_namespace)::RpcConnectionState::RpcRequest::send()::{lambda(kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>&&)#1},kj::_::PropagateException>>
            ::instance;
      local_368._0_8_ =
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<capnp::Response<capnp::AnyPointer>,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,capnp::_::(anonymous_namespace)::RpcConnectionState::RpcRequest::send()::{lambda(kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>&&)#1},kj::_::PropagateException>>
            ::instance;
      replacement.super_Builder.builder.capTable = (CapTableBuilder *)0x0;
      appPromise.super_PromiseBase.node.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<capnp::Response<capnp::AnyPointer>,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,capnp::_::(anonymous_namespace)::RpcConnectionState::RpcRequest::send()::{lambda(kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>&&)#1},kj::_::PropagateException>>
            ::instance;
      local_368._8_8_ = (PipelineHook *)0x0;
      appPromise.super_PromiseBase.node.ptr = (PromiseNode *)this_00;
      kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_368);
      kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&replacement);
      kj::Own<kj::_::PromiseNode>::dispose(&local_378);
      replacement.super_Builder.builder.capTable = (CapTableBuilder *)pipeline.ptr;
      pipeline.ptr = (RpcPipeline *)0x0;
      local_368._0_8_ = pipeline.disposer;
      replacement.super_Builder.builder.segment = (SegmentBuilder *)pipeline.disposer;
      local_368._8_8_ = (PipelineHook *)0x0;
      replacement.super_Builder.builder.pointer = (WirePointer *)0x0;
      replacement.hook.disposer = (Disposer *)0x0;
      replacement.hook.ptr = (RequestHook *)0x0;
      RemotePromise<capnp::AnyPointer>::RemotePromise
                ((RemotePromise<capnp::AnyPointer> *)this,&appPromise,(Pipeline *)&replacement);
      AnyPointer::Pipeline::~Pipeline((Pipeline *)&replacement);
      kj::Own<capnp::PipelineHook>::dispose((Own<capnp::PipelineHook> *)local_368);
      kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&appPromise);
      kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline>::~Own(&pipeline);
      kj::
      Own<kj::_::ForkHub<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
      ::~Own(&forkedPromise.hub);
      SendInternalResult::~SendInternalResult(&sendResult);
    }
    else {
      pvVar4 = (this_01->callBuilder)._builder.data;
      uVar5 = *(undefined8 *)((long)pvVar4 + 8);
      uVar1 = *(ushort *)((long)pvVar4 + 4);
      MVar7 = AnyPointer::Builder::targetSize(&this_01->paramsBuilder);
      local_1b8 = (pointer)MVar7.wordCount;
      __flags_00 = (int)local_1c0;
      local_1c0[0] = 1;
      local_1b0 = MVar7.capCount;
      __n_00 = (size_t)uVar1;
      (**((CapTableReader *)&pCVar6->_vptr_ClientHook)->_vptr_CapTableReader)
                (&replacement,pCVar6,uVar5);
      PointerBuilder::asReader(&(this_01->paramsBuilder).builder);
      other.capTable._0_4_ = (int)local_368._56_8_;
      other.segment = (SegmentReader *)local_368._48_8_;
      other.capTable._4_4_ = SUB84(local_368._56_8_,4);
      other.pointer._0_4_ = (int)local_368._64_8_;
      other.pointer._4_4_ = SUB84(local_368._64_8_,4);
      other.nestingLimit = (int)local_368._72_8_;
      other._28_4_ = SUB84(local_368._72_8_,4);
      PointerBuilder::copyFrom((PointerBuilder *)&replacement,other,false);
      Request<capnp::AnyPointer,_capnp::AnyPointer>::send
                ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)this,(int)&replacement,__buf_00,
                 __n_00,__flags_00);
      kj::Own<capnp::RequestHook>::dispose(&replacement.hook);
    }
    kj::Own<capnp::ClientHook>::dispose(&local_3a8);
  }
  else {
    other_00 = &(pRVar2->connection).field_1;
    kj::Exception::Exception((Exception *)&replacement,(Exception *)other_00);
    kj::Promise<capnp::Response<capnp::AnyPointer>_>::Promise
              ((Promise<capnp::Response<capnp::AnyPointer>_> *)&local_3a8,(Exception *)&replacement)
    ;
    kj::Exception::Exception((Exception *)&sendResult,(Exception *)other_00);
    newBrokenPipeline((capnp *)&forkedPromise,(Exception *)&sendResult);
    local_368._0_8_ = forkedPromise.hub.disposer;
    local_368._8_8_ = forkedPromise.hub.ptr;
    forkedPromise.hub.ptr =
         (ForkHub<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> *)0x0;
    local_368._16_8_ = (PipelineOp *)0x0;
    local_368._24_8_ = 0;
    local_368._32_8_ = (ArrayDisposer *)0x0;
    RemotePromise<capnp::AnyPointer>::RemotePromise
              ((RemotePromise<capnp::AnyPointer> *)this,
               (Promise<capnp::Response<capnp::AnyPointer>_> *)&local_3a8,(Pipeline *)local_368);
    AnyPointer::Pipeline::~Pipeline((Pipeline *)local_368);
    kj::Own<capnp::PipelineHook>::dispose((Own<capnp::PipelineHook> *)&forkedPromise);
    kj::Exception::~Exception((Exception *)&sendResult);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_3a8);
    kj::Exception::~Exception((Exception *)&replacement);
  }
  return (ssize_t)this;
}

Assistant:

RemotePromise<AnyPointer> send() override {
      if (!connectionState->connection.is<Connected>()) {
        // Connection is broken.
        const kj::Exception& e = connectionState->connection.get<Disconnected>();
        return RemotePromise<AnyPointer>(
            kj::Promise<Response<AnyPointer>>(kj::cp(e)),
            AnyPointer::Pipeline(newBrokenPipeline(kj::cp(e))));
      }

      KJ_IF_MAYBE(redirect, target->writeTarget(callBuilder.getTarget())) {
        // Whoops, this capability has been redirected while we were building the request!
        // We'll have to make a new request and do a copy.  Ick.

        auto replacement = redirect->get()->newCall(
            callBuilder.getInterfaceId(), callBuilder.getMethodId(), paramsBuilder.targetSize());
        replacement.set(paramsBuilder);
        return replacement.send();
      } else {
        auto sendResult = sendInternal(false);

        auto forkedPromise = sendResult.promise.fork();

        // The pipeline must get notified of resolution before the app does to maintain ordering.
        auto pipeline = kj::refcounted<RpcPipeline>(
            *connectionState, kj::mv(sendResult.questionRef), forkedPromise.addBranch());

        auto appPromise = forkedPromise.addBranch().then(
            [=](kj::Own<RpcResponse>&& response) {
              auto reader = response->getResults();
              return Response<AnyPointer>(reader, kj::mv(response));
            });

        return RemotePromise<AnyPointer>(
            kj::mv(appPromise),
            AnyPointer::Pipeline(kj::mv(pipeline)));
      }